

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O0

int __thiscall SkipList::remove(SkipList *this,char *__filename)

{
  ulong uVar1;
  Node *this_00;
  reference ppNVar2;
  ulong uVar3;
  long lVar4;
  undefined8 extraout_RAX;
  bool bVar5;
  Node *t;
  Node *local_78;
  Node *p;
  stack<SkipList::Node_*,_std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>_> path;
  uint64_t key_local;
  SkipList *this_local;
  
  path.c.super__Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)__filename;
  std::stack<SkipList::Node*,std::deque<SkipList::Node*,std::allocator<SkipList::Node*>>>::
  stack<std::deque<SkipList::Node*,std::allocator<SkipList::Node*>>,void>
            ((stack<SkipList::Node*,std::deque<SkipList::Node*,std::allocator<SkipList::Node*>>> *)
             &p);
  for (local_78 = this->head; local_78 != (Node *)0x0; local_78 = local_78->down) {
    while( true ) {
      bVar5 = false;
      if (local_78->right != (Node *)0x0) {
        bVar5 = (_Map_pointer)local_78->right->key <
                path.c.super__Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node;
      }
      if (!bVar5) break;
      local_78 = local_78->right;
    }
    std::stack<SkipList::Node_*,_std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>_>::
    push((stack<SkipList::Node_*,_std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>_>
          *)&p,&local_78);
  }
  ppNVar2 = std::
            stack<SkipList::Node_*,_std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>_>
            ::top((stack<SkipList::Node_*,_std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>_>
                   *)&p);
  local_78 = (*ppNVar2)->right;
  if ((local_78 == (Node *)0x0) ||
     ((_Map_pointer)local_78->key !=
      path.c.super__Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node)) {
    this_local._7_1_ = 0;
  }
  else {
    this->length = this->length - 1;
    uVar1 = this->valueSize;
    uVar3 = std::__cxx11::string::size();
    if (uVar1 < uVar3) {
      __assert_fail("valueSize >= p->value.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/markcty[P]LSM-KV/SkipList.cpp"
                    ,0x54,"bool SkipList::remove(uint64_t)");
    }
    lVar4 = std::__cxx11::string::size();
    this->valueSize = this->valueSize - lVar4;
    while (bVar5 = std::
                   stack<SkipList::Node_*,_std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>_>
                   ::empty((stack<SkipList::Node_*,_std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>_>
                            *)&p), ((bVar5 ^ 0xffU) & 1) != 0) {
      ppNVar2 = std::
                stack<SkipList::Node_*,_std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>_>
                ::top((stack<SkipList::Node_*,_std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>_>
                       *)&p);
      local_78 = *ppNVar2;
      std::stack<SkipList::Node_*,_std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>_>
      ::pop((stack<SkipList::Node_*,_std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>_>
             *)&p);
      this_00 = local_78->right;
      if ((this_00 == (Node *)0x0) ||
         ((_Map_pointer)this_00->key !=
          path.c.super__Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_node)) {
        this_local._7_1_ = 1;
        goto LAB_0010f8e5;
      }
      local_78->right = this_00->right;
      if (this_00 != (Node *)0x0) {
        Node::~Node(this_00);
        operator_delete(this_00,0x38);
      }
    }
    this_local._7_1_ = 1;
  }
LAB_0010f8e5:
  std::stack<SkipList::Node_*,_std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>_>::
  ~stack((stack<SkipList::Node_*,_std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>_>
          *)&p);
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),this_local._7_1_);
}

Assistant:

bool SkipList::remove(uint64_t key) {
  // search the key
  stack<Node *> path;
  Node *p = head;
  while (p) {
    while (p->right && p->right->key < key) p = p->right;
    path.push(p);
    p = p->down;
  }

  // Does the key exist?
  p = path.top()->right;
  if (!p || p->key != key) return false;

  length--;
  assert(valueSize >= p->value.size());
  valueSize -= p->value.size();
  // remove the tower
  while (!path.empty()) {
    p = path.top();
    path.pop();
    Node *t = p->right;
    if (!t || t->key != key) return true;
    p->right = t->right;
    delete t;
  }
  return true;
}